

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O2

ssize_t tnt_object_add_float(tnt_stream *s,float value)

{
  int *piVar1;
  byte bVar2;
  long *plVar3;
  ssize_t sVar4;
  char local_e;
  uint local_d;
  char data [6];
  
  plVar3 = *(long **)((long)s->data + 0x30);
  bVar2 = *(byte *)(plVar3 + 1);
  if (bVar2 != 0) {
    piVar1 = (int *)(*plVar3 + 8 + (ulong)(bVar2 - 1) * 0x10);
    *piVar1 = *piVar1 + 1;
  }
  local_e = -0x36;
  local_d = (uint)value >> 0x18 | ((uint)value & 0xff0000) >> 8 | ((uint)value & 0xff00) << 8 |
            (int)value << 0x18;
  sVar4 = (*s->write)(s,&local_e,5);
  return sVar4;
}

Assistant:

ssize_t
tnt_object_add_float (struct tnt_stream *s, float value)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[6], *end;
	end = mp_encode_float(data, value);
	return s->write(s, data, end - data);
}